

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O0

void __thiscall icu_63::RBBIRuleBuilder::~RBBIRuleBuilder(RBBIRuleBuilder *this)

{
  RBBISetBuilder *this_00;
  RBBITableBuilder *this_01;
  RBBINode *pRVar1;
  void *p;
  RBBINode *n;
  int i;
  RBBIRuleBuilder *this_local;
  
  this->_vptr_RBBIRuleBuilder = (_func_int **)&PTR__RBBIRuleBuilder_004b1cb0;
  n._4_4_ = 0;
  while( true ) {
    p = (void *)(ulong)n._4_4_;
    pRVar1 = (RBBINode *)UVector::elementAt(this->fUSetNodes,n._4_4_);
    if (pRVar1 == (RBBINode *)0x0) break;
    if (pRVar1 != (RBBINode *)0x0) {
      RBBINode::~RBBINode(pRVar1);
      UMemory::operator_delete((UMemory *)pRVar1,p);
    }
    n._4_4_ = n._4_4_ + 1;
  }
  if (this->fUSetNodes != (UVector *)0x0) {
    (*(this->fUSetNodes->super_UObject)._vptr_UObject[1])();
  }
  this_00 = this->fSetBuilder;
  if (this_00 != (RBBISetBuilder *)0x0) {
    RBBISetBuilder::~RBBISetBuilder(this_00);
    UMemory::operator_delete((UMemory *)this_00,p);
  }
  this_01 = this->fForwardTable;
  if (this_01 != (RBBITableBuilder *)0x0) {
    RBBITableBuilder::~RBBITableBuilder(this_01);
    UMemory::operator_delete((UMemory *)this_01,p);
  }
  pRVar1 = this->fForwardTree;
  if (pRVar1 != (RBBINode *)0x0) {
    RBBINode::~RBBINode(pRVar1);
    UMemory::operator_delete((UMemory *)pRVar1,p);
  }
  pRVar1 = this->fReverseTree;
  if (pRVar1 != (RBBINode *)0x0) {
    RBBINode::~RBBINode(pRVar1);
    UMemory::operator_delete((UMemory *)pRVar1,p);
  }
  pRVar1 = this->fSafeFwdTree;
  if (pRVar1 != (RBBINode *)0x0) {
    RBBINode::~RBBINode(pRVar1);
    UMemory::operator_delete((UMemory *)pRVar1,p);
  }
  pRVar1 = this->fSafeRevTree;
  if (pRVar1 != (RBBINode *)0x0) {
    RBBINode::~RBBINode(pRVar1);
    UMemory::operator_delete((UMemory *)pRVar1,p);
  }
  if (this->fScanner != (RBBIRuleScanner *)0x0) {
    (*this->fScanner->_vptr_RBBIRuleScanner[1])();
  }
  if (this->fRuleStatusVals != (UVector *)0x0) {
    (*(this->fRuleStatusVals->super_UObject)._vptr_UObject[1])();
  }
  UnicodeString::~UnicodeString(&this->fStrippedRules);
  return;
}

Assistant:

RBBIRuleBuilder::~RBBIRuleBuilder() {

    int        i;
    for (i=0; ; i++) {
        RBBINode *n = (RBBINode *)fUSetNodes->elementAt(i);
        if (n==NULL) {
            break;
        }
        delete n;
    }

    delete fUSetNodes;
    delete fSetBuilder;
    delete fForwardTable;
    delete fForwardTree;
    delete fReverseTree;
    delete fSafeFwdTree;
    delete fSafeRevTree;
    delete fScanner;
    delete fRuleStatusVals;
}